

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall
Minisat::IntOption::getNonDefaultString(IntOption *this,int granularity,char *buffer,size_t size)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int i;
  uint uVar8;
  vector<int,_std::allocator<int>_> values;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  if (granularity == 0) {
    uVar8 = (this->range).begin;
    uVar4 = (this->range).end;
    if ((uVar4 - uVar8) - 2 < 0xf) {
      for (; (int)uVar8 <= (int)uVar4; uVar8 = uVar8 + 1) {
        if (uVar8 != this->defaultValue) {
          snprintf(buffer,size,"%d",(ulong)uVar8);
          sVar3 = strlen(buffer);
          size = ~sVar3 + size;
          uVar1 = (this->range).end;
          uVar4 = uVar8;
          if ((uVar8 != uVar1) && (uVar4 = uVar1, uVar8 + 1 != this->defaultValue)) {
            buffer[(int)sVar3] = ',';
            lVar5 = (long)((sVar3 << 0x20) + 0x100000000) >> 0x20;
            buffer[lVar5] = '\0';
            buffer = buffer + lVar5;
            uVar4 = (this->range).end;
          }
        }
      }
    }
    return;
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fillGranularityDomain(this,granularity,(vector<int,_std::allocator<int>_> *)&local_48);
  uVar7 = 0;
  do {
    uVar6 = uVar7;
    while( true ) {
      if ((ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar6) {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
        return;
      }
      if (local_48._M_impl.super__Vector_impl_data._M_start[uVar6] != this->defaultValue) break;
      uVar6 = uVar6 + 1;
    }
    snprintf(buffer,size,"%d");
    sVar3 = strlen(buffer);
    size = ~sVar3 + size;
    uVar7 = uVar6 + 1;
    if ((uVar7 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2)) &&
       (local_48._M_impl.super__Vector_impl_data._M_start[uVar6 + 1] != this->defaultValue)) {
      buffer[(int)sVar3] = ',';
      iVar2 = (int)sVar3 + 1;
      buffer[iVar2] = '\0';
      buffer = buffer + iVar2;
      uVar7 = uVar6 + 1;
    }
  } while( true );
}

Assistant:

virtual void getNonDefaultString(int granularity, char *buffer, size_t size)
    {
        if (granularity != 0) {
            std::vector<int> values;
            fillGranularityDomain(granularity, values);
            for (size_t i = 0; i < values.size(); ++i) {
                if (values[i] == defaultValue) {
                    continue;
                }                                        // do not print default value
                snprintf(buffer, size, "%d", values[i]); // convert value
                const int sl = strlen(buffer);
                size = size - strlen(buffer) - 1; // store new size
                if (i + 1 < values.size() && values[i + 1] != defaultValue) {
                    buffer[sl] = ',';           // set separator
                    buffer[sl + 1] = 0;         // indicate end of buffer
                    buffer = &(buffer[sl + 1]); // move start pointer accordingly (len is one more now)
                }
            }
        } else if (range.end - range.begin <= 16 && range.end - range.begin > 1) {
            for (int i = range.begin; i <= range.end; ++i) {
                if (i == defaultValue) {
                    continue;
                }                                // do not print default value
                snprintf(buffer, size, "%d", i); // convert value
                const int sl = strlen(buffer);
                size = size - strlen(buffer) - 1; // store new size
                if (i != range.end && i + 1 != defaultValue) {
                    buffer[sl] = ',';           // set separator
                    buffer[sl + 1] = 0;         // indicate end of buffer
                    buffer = &(buffer[sl + 1]); // move start pointer accordingly (len is one more now)
                }
            }
        }
    }